

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

EStatusCode __thiscall CFFFileInput::ReadTopDictIndex(CFFFileInput *this,unsigned_short inFontIndex)

{
  CFFPrimitiveReader *this_00;
  unsigned_long *puVar1;
  EStatusCode EVar2;
  LongFilePositionType LVar3;
  ulong *puVar4;
  ulong *puVar5;
  long lVar6;
  unsigned_short dictionariesCount;
  unsigned_long *offsets;
  ushort local_32;
  unsigned_long *local_30;
  
  this_00 = &this->mPrimitivesReader;
  LVar3 = CFFPrimitiveReader::GetCurrentPosition(this_00);
  this->mTopDictIndexPosition = LVar3;
  EVar2 = ReadIndexHeader(this,&local_30,&local_32);
  if (EVar2 == eSuccess) {
    puVar4 = (ulong *)operator_new__((ulong)local_32 * 0x50 + 8);
    puVar1 = local_30;
    *puVar4 = (ulong)local_32;
    if ((ulong)local_32 != 0) {
      puVar5 = puVar4 + 2;
      lVar6 = (ulong)local_32 * 0x50;
      do {
        *(undefined4 *)puVar5 = 0;
        puVar5[1] = 0;
        puVar5[2] = (ulong)puVar5;
        puVar5[3] = (ulong)puVar5;
        puVar5[4] = 0;
        puVar5[5] = 0;
        puVar5[6] = 0;
        puVar5[7] = 0;
        puVar5[8] = 0;
        puVar5 = puVar5 + 10;
        lVar6 = lVar6 + -0x50;
      } while (lVar6 != 0);
    }
    this->mTopDictIndex = (TopDictInfo *)(puVar4 + 1);
    if (local_30[inFontIndex] != 1) {
      CFFPrimitiveReader::Skip(this_00,local_30[inFontIndex] - 1);
    }
    EVar2 = ReadDict(this,puVar1[(ulong)inFontIndex + 1] - puVar1[inFontIndex],
                     (UShortToDictOperandListMap *)
                     (&(this->mTopDictIndex->mTopDict)._M_t._M_impl.field_0x0 +
                     (uint)inFontIndex * 0x50));
  }
  if (local_30 != (unsigned_long *)0x0) {
    operator_delete__(local_30);
  }
  if (EVar2 == eSuccess) {
    EVar2 = CFFPrimitiveReader::GetInternalState(this_00);
  }
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadTopDictIndex(unsigned short inFontIndex)
{
	mTopDictIndexPosition = mPrimitivesReader.GetCurrentPosition();

	// will read only what's necessary for the font index, nulling items in the path
	
	unsigned long* offsets;
	unsigned short dictionariesCount;
	EStatusCode status = ReadIndexHeader(&offsets,dictionariesCount);
	
	do
	{
		if(status != PDFHummus::eSuccess)
			break;

		// allocate all, but read just the required font
		mTopDictIndex = new TopDictInfo[dictionariesCount];

		if(offsets[inFontIndex] != 1)
			mPrimitivesReader.Skip(offsets[inFontIndex] - 1);
		status = ReadDict(offsets[inFontIndex+1] - offsets[inFontIndex],mTopDictIndex[inFontIndex].mTopDict);
	}while(false);

	delete[] offsets;
	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}